

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeSimilarFunctions.cpp
# Opt level: O2

void __thiscall
wasm::MergeSimilarFunctions::collectEquivalentClasses
          (MergeSimilarFunctions *this,
          vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_> *classes,
          Module *module)

{
  pointer *__k;
  pointer puVar1;
  Function *pFVar2;
  pointer pEVar3;
  bool bVar4;
  mapped_type_conflict *__k_00;
  mapped_type *this_00;
  _Rb_tree_node_base *p_Var5;
  undefined1 auVar6 [8];
  ulong uVar7;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import;
  pointer puVar8;
  initializer_list<wasm::Function_*> __l;
  initializer_list<wasm::EquivalentClass> __l_00;
  initializer_list<wasm::Function_*> __l_01;
  undefined1 local_378 [8];
  PassRunner runner;
  map<unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
  hashGroups;
  _Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_> local_130;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  undefined1 local_f8 [8];
  Map hashes;
  _Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_> local_a8;
  back_insert_iterator<std::vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>_>
  local_90;
  undefined1 local_88 [8];
  vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_> classesInGroup;
  _Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_> local_68;
  Function *local_50;
  _Rb_tree_node_base *local_48;
  Function *local_40;
  Function *func;
  
  local_90.container = classes;
  FunctionHasher::createMap((Map *)local_f8,module);
  PassRunner::PassRunner((PassRunner *)local_378,module);
  local_118._M_unused._M_object = &local_118;
  local_118._8_8_ = 0;
  local_100 = std::
              _Function_handler<bool_(wasm::Expression_*,_unsigned_long_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MergeSimilarFunctions.cpp:290:5)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<bool_(wasm::Expression_*,_unsigned_long_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MergeSimilarFunctions.cpp:290:5)>
              ::_M_manager;
  std::function<bool_(wasm::Expression_*,_unsigned_long_&)>::function
            ((function<bool_(wasm::Expression_*,_unsigned_long_&)> *)
             &hashes.
              super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
              ._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (function<bool_(wasm::Expression_*,_unsigned_long_&)> *)local_118._M_unused._0_8_);
  FunctionHasher::FunctionHasher
            ((FunctionHasher *)&runner.isNested,(Map *)local_f8,
             (ExprHasher *)
             &hashes.
              super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
              ._M_t._M_impl.super__Rb_tree_header._M_node_count);
  WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>::
  run((WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>
       *)&runner.isNested,(PassRunner *)local_378,module);
  FunctionHasher::~FunctionHasher((FunctionHasher *)&runner.isNested);
  std::_Function_base::~_Function_base
            ((_Function_base *)
             &hashes.
              super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
              ._M_t._M_impl.super__Rb_tree_header._M_node_count);
  hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&hashGroups;
  hashGroups._M_t._M_impl._0_4_ = 0;
  hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  puVar1 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __k = &classesInGroup.
         super__Vector_base<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  for (puVar8 = (module->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      p_Var5 = hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent, puVar8 != puVar1;
      puVar8 = puVar8 + 1) {
    pFVar2 = (puVar8->_M_t).
             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
             super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    if (*(char **)((long)&(pFVar2->super_Importable).module + 8) == (char *)0x0) {
      classesInGroup.
      super__Vector_base<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pFVar2;
      __k_00 = std::
               map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
               ::operator[]((map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
                             *)local_f8,(key_type *)__k);
      this_00 = std::
                map<unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                ::operator[]((map<unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                              *)&runner.isNested,__k_00);
      std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::push_back
                (this_00,(value_type *)__k);
    }
  }
  do {
    if (p_Var5 == (_Rb_tree_node_base *)&hashGroups) {
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                   *)&runner.isNested);
      std::_Function_base::~_Function_base((_Function_base *)&local_118);
      PassRunner::~PassRunner((PassRunner *)local_378);
      std::
      _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::Function_*const,_unsigned_long>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
      ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::Function_*const,_unsigned_long>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
                   *)local_f8);
      return;
    }
    if (8 < (ulong)((long)p_Var5[1]._M_left - (long)p_Var5[1]._M_parent)) {
      pFVar2 = *(Function **)p_Var5[1]._M_parent;
      __l._M_len = 1;
      __l._M_array = &local_40;
      local_40 = pFVar2;
      std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::vector
                ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&local_a8,__l,
                 (allocator_type *)&local_50);
      classesInGroup.
      super__Vector_base<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pFVar2;
      std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::vector
                ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&local_68,
                 (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&local_a8);
      __l_00._M_len = 1;
      __l_00._M_array =
           (iterator)
           &classesInGroup.
            super__Vector_base<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_48 = p_Var5;
      std::vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>::vector
                ((vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_> *)local_88,
                 __l_00,(allocator_type *)((long)&func + 7));
      std::_Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>::~_Vector_base
                (&local_68);
      std::_Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>::~_Vector_base
                (&local_a8);
      for (uVar7 = 1;
          pEVar3 = classesInGroup.
                   super__Vector_base<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          uVar7 < (ulong)((long)local_48[1]._M_left - (long)local_48[1]._M_parent >> 3);
          uVar7 = (ulong)((int)uVar7 + 1)) {
        local_40 = *(Function **)(&(local_48[1]._M_parent)->_M_color + uVar7 * 2);
        for (auVar6 = local_88; pFVar2 = local_40, auVar6 != (undefined1  [8])pEVar3;
            auVar6 = (undefined1  [8])((long)auVar6 + 0x20)) {
          bVar4 = areInEquvalentClass(this,((EquivalentClass *)auVar6)->primaryFunction,local_40,
                                      module);
          if (bVar4) {
            std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::push_back
                      (&((EquivalentClass *)auVar6)->functions,&local_40);
            goto LAB_00a96b29;
          }
        }
        local_50 = local_40;
        __l_01._M_len = 1;
        __l_01._M_array = &local_50;
        std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::vector
                  ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&local_130,__l_01,
                   (allocator_type *)((long)&func + 7));
        classesInGroup.
        super__Vector_base<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)pFVar2;
        std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::vector
                  ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&local_68,
                   (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&local_130);
        std::vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>::
        emplace_back<wasm::EquivalentClass>
                  ((vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_> *)local_88
                   ,(EquivalentClass *)
                    &classesInGroup.
                     super__Vector_base<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::_Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>::~_Vector_base
                  (&local_68);
        std::_Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>::~_Vector_base
                  (&local_130);
LAB_00a96b29:
      }
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<wasm::EquivalentClass*,std::back_insert_iterator<std::vector<wasm::EquivalentClass,std::allocator<wasm::EquivalentClass>>>>
                ((EquivalentClass *)local_88,
                 classesInGroup.
                 super__Vector_base<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>.
                 _M_impl.super__Vector_impl_data._M_start,local_90);
      std::vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>::~vector
                ((vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_> *)local_88);
      p_Var5 = local_48;
    }
    p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
  } while( true );
}

Assistant:

void MergeSimilarFunctions::collectEquivalentClasses(
  std::vector<EquivalentClass>& classes, Module* module) {
  auto hashes = FunctionHasher::createMap(module);
  PassRunner runner(module);

  std::function<bool(Expression*, size_t&)> ignoringConsts =
    [&](Expression* expr, size_t& digest) {
      // Ignore const's immediate operands.
      if (expr->is<Const>()) {
        return true;
      }
      // Ignore callee operands.
      if (auto* call = expr->dynCast<Call>()) {
        for (auto operand : call->operands) {
          rehash(digest,
                 ExpressionAnalyzer::flexibleHash(operand, ignoringConsts));
        }
        rehash(digest, call->isReturn);
        return true;
      }
      return false;
    };
  FunctionHasher(&hashes, ignoringConsts).run(&runner, module);

  // Find hash-equal groups.
  std::map<size_t, std::vector<Function*>> hashGroups;
  ModuleUtils::iterDefinedFunctions(
    *module, [&](Function* func) { hashGroups[hashes[func]].push_back(func); });

  for (auto& [_, hashGroup] : hashGroups) {
    if (hashGroup.size() < 2) {
      continue;
    }

    // Collect exactly equivalent functions ignoring constants.
    std::vector<EquivalentClass> classesInGroup = {
      EquivalentClass(hashGroup[0], {hashGroup[0]})};

    for (Index i = 1; i < hashGroup.size(); i++) {
      auto* func = hashGroup[i];
      bool found = false;
      for (auto& newClass : classesInGroup) {
        if (areInEquvalentClass(newClass.primaryFunction, func, module)) {
          newClass.functions.push_back(func);
          found = true;
          break;
        }
      }

      if (!found) {
        // Same hash but different instruction pattern.
        classesInGroup.push_back(EquivalentClass(func, {func}));
      }
    }
    std::copy(classesInGroup.begin(),
              classesInGroup.end(),
              std::back_inserter(classes));
  }
}